

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>_>
::~ExceptionOr(ExceptionOr<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>_>
               *this)

{
  NullableValue<capnp::Response<capnproto_test::capnp::test::TestInterface::GetTestTailCallerResults>_>
  ::~NullableValue(&(this->value).ptr);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)this);
  return;
}

Assistant:

ExceptionOr(T&& value): value(kj::mv(value)) {}